

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_aad_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  size_t sVar3;
  long lVar4;
  long in_RDX;
  size_t sVar5;
  size_t sVar6;
  uint8_t *__src;
  uint8_t iv_1 [16];
  char enc [256];
  char dec [256];
  byte abStack_260 [8];
  undefined1 local_258 [24];
  size_t local_240;
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  ppVar2 = new_aead((ptls_aead_algorithm_t *)cs1,(ptls_hash_algorithm_t *)cs2,1,
                    "012345678901234567890123456789012345678901234567",(ptls_iovec_t)ZEXT816(0),
                    (char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0xb2,"void test_aad_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  sVar5 = ppVar2->algo->iv_size;
  if (sVar5 - 8 != 0) {
    memcpy(local_238,ppVar2->static_iv,sVar5 - 8);
  }
  lVar4 = 0x38;
  do {
    local_238[sVar5 - 8] = (byte)(0x7bL >> ((byte)lVar4 & 0x3f)) ^ ppVar2->static_iv[sVar5 - 8];
    lVar4 = lVar4 + -8;
    sVar5 = sVar5 + 1;
  } while (lVar4 != -8);
  (*ppVar2->do_encrypt_init)(ppVar2,local_238,"my true aad",0xb);
  sVar5 = (*ppVar2->do_encrypt_update)(ppVar2,local_238,"hello world",0xb);
  sVar3 = (*ppVar2->do_encrypt_final)(ppVar2,local_238 + sVar5);
  (*ppVar2->dispose_crypto)(ppVar2);
  (*ptls_clear_memory)(ppVar2->static_iv,ppVar2->algo->iv_size);
  free(ppVar2);
  ppVar2 = new_aead(*(ptls_aead_algorithm_t **)(in_RDX + 8),
                    *(ptls_hash_algorithm_t **)(in_RDX + 0x10),0,
                    "012345678901234567890123456789012345678901234567",(ptls_iovec_t)ZEXT816(0),
                    (char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    sVar6 = ppVar2->algo->iv_size;
    __src = ppVar2->static_iv;
    if (sVar6 - 8 != 0) {
      memcpy(local_258,__src,sVar6 - 8);
    }
    lVar4 = 0x38;
    do {
      abStack_260[sVar6] = (byte)(0x7bL >> ((byte)lVar4 & 0x3f)) ^ ppVar2->static_iv[sVar6 - 8];
      lVar4 = lVar4 + -8;
      sVar6 = sVar6 + 1;
    } while (lVar4 != -8);
    local_240 = sVar3 + sVar5;
    sVar5 = (*ppVar2->do_decrypt)
                      (ppVar2,local_138,local_238,sVar3 + sVar5,local_258,"my true aad",0xb);
    _ok((uint)(sVar5 == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0xbc
       );
    iVar1 = bcmp("hello world",local_138,sVar5);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0xbd
       );
    sVar5 = ppVar2->algo->iv_size;
    if (sVar5 - 8 != 0) {
      memcpy(local_258,__src,sVar5 - 8);
    }
    lVar4 = 0x38;
    do {
      abStack_260[sVar5] = (byte)(0x7bL >> ((byte)lVar4 & 0x3f)) ^ ppVar2->static_iv[sVar5 - 8];
      lVar4 = lVar4 + -8;
      sVar5 = sVar5 + 1;
    } while (lVar4 != -8);
    sVar5 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_238,local_240,local_258,"my fake aad",0xb);
    _ok((uint)(sVar5 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0xbf
       );
    (*ppVar2->dispose_crypto)(ppVar2);
    (*ptls_clear_memory)(__src,ppVar2->algo->iv_size);
    free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0xba,"void test_aad_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aad_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src = "hello world", *aad = "my true aad";
    ptls_aead_context_t *c;
    char enc[256], dec[256];
    size_t enclen, declen;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_encrypt_init(c, 123, aad, strlen(aad));
    enclen = ptls_aead_encrypt_update(c, enc, src, strlen(src));
    enclen += ptls_aead_encrypt_final(c, enc + enclen);
    ptls_aead_free(c);

    /* decrypt */
    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, "my fake aad", strlen(aad));
    ok(declen == SIZE_MAX);
    ptls_aead_free(c);
}